

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

void __thiscall script_tests::script_PushData::test_method(script_PushData *this)

{
  readonly_property65 rVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack_ignore;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata4_trunc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata2_trunc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata1_trunc;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  pushdata4Stack;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  pushdata2Stack;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  pushdata1Stack;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  directStack;
  ScriptError err;
  check_type cVar6;
  char *pcVar5;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  undefined4 local_41c;
  assertion_result local_418;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_3a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_390;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_378;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_360;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2b8;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_208;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_158;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_d8;
  ScriptError local_b4;
  undefined4 *local_b0;
  ScriptError *local_a8;
  BaseSignatureChecker local_a0;
  char *local_98;
  assertion_result local_90;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  undefined1 local_58 [24];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  local_d8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x3c3;
  file.m_begin = (iterator)&local_e8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,"\x01Z","L\x01Z");
  local_158.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_0138d260;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EvalScript(&local_d8,(CScript *)local_58,1,(BaseSignatureChecker *)&local_158,BASE,&local_b4)
  ;
  local_418.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_418.m_message.px = (element_type *)0x0;
  local_418.m_message.pn.pi_ = (sp_counted_base *)0x0;
  aStack_68._8_8_ = &local_90;
  local_90._0_8_ =
       "EvalScript(directStack, CScript(direct, direct + sizeof(direct)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err)"
  ;
  local_90.m_message.px = (element_type *)0xeae6a5;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_01389048;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_100 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_418,(lazy_ostream *)local_78,1,0,WARN,_cVar6,(size_t)&local_108,0x3c3);
  boost::detail::shared_count::~shared_count(&local_418.m_message.pn);
  if (0x1c < local_40._4_4_) {
    free((void *)local_58._0_8_);
  }
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3c4;
  file_00.m_begin = (iterator)&local_118;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
             msg_00);
  local_418.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_b4 == SCRIPT_ERR_OK);
  local_418.m_message.px = (element_type *)0x0;
  local_418.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_78,local_b4);
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01388e08;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_130 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x1;
  local_40 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_418,(lazy_ostream *)local_58,1,1,WARN,_cVar6,(size_t)&local_138,0x3c4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(aStack_68._M_allocated_capacity + 1));
  }
  boost::detail::shared_count::~shared_count(&local_418.m_message.pn);
  local_158.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  local_158.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  local_158.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x3c7;
  file_01.m_begin = (iterator)&local_168;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_178,
             msg_01);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,"L\x01Z","M\x01");
  local_208.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_0138d260;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EvalScript(&local_158,(CScript *)local_58,1,(BaseSignatureChecker *)&local_208,BASE,&local_b4
                 );
  local_418.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_418.m_message.px = (element_type *)0x0;
  local_418.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "EvalScript(pushdata1Stack, CScript(pushdata1, pushdata1 + sizeof(pushdata1)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err)"
  ;
  local_90.m_message.px = (element_type *)0xeae737;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_01389048;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_90;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_180 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_418,(lazy_ostream *)local_78,1,0,WARN,_cVar6,(size_t)&local_188,0x3c7);
  boost::detail::shared_count::~shared_count(&local_418.m_message.pn);
  if (0x1c < local_40._4_4_) {
    free((void *)local_58._0_8_);
  }
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x3c8;
  file_02.m_begin = (iterator)&local_198;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a8,
             msg_02);
  if ((long)local_158.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_158.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)local_d8.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = std::__equal<false>::
            equal<std::vector<unsigned_char,std::allocator<unsigned_char>>const*,std::vector<unsigned_char,std::allocator<unsigned_char>>const*>
                      (local_158.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_158.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       local_d8.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    bVar2 = false;
  }
  local_78[0] = bVar2;
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_418._0_8_ = "pushdata1Stack == directStack";
  local_418.m_message.px = (element_type *)0xeae755;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01389048;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_1b0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_40 = (string *)&local_418;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar6,
             (size_t)&local_1b8,0x3c8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x3c9;
  file_03.m_begin = (iterator)&local_1c8;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d8,
             msg_03);
  local_418.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_b4 == SCRIPT_ERR_OK);
  local_418.m_message.px = (element_type *)0x0;
  local_418.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_78,local_b4);
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01388e08;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_1e0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x1;
  local_40 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_418,(lazy_ostream *)local_58,1,1,WARN,_cVar6,(size_t)&local_1e8,0x3c9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,aStack_68._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_418.m_message.pn);
  local_208.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  local_208.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  local_208.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x3cc;
  file_04.m_begin = (iterator)&local_218;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_228,
             msg_04);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,"M\x01","N\x01");
  local_2b8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_0138d260;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EvalScript(&local_208,(CScript *)local_58,1,(BaseSignatureChecker *)&local_2b8,BASE,&local_b4
                 );
  local_418.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_418.m_message.px = (element_type *)0x0;
  local_418.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "EvalScript(pushdata2Stack, CScript(pushdata2, pushdata2 + sizeof(pushdata2)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err)"
  ;
  local_90.m_message.px = (element_type *)0xeae7e7;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_01389048;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_90;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_230 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_418,(lazy_ostream *)local_78,1,0,WARN,_cVar6,(size_t)&local_238,0x3cc);
  boost::detail::shared_count::~shared_count(&local_418.m_message.pn);
  if (0x1c < local_40._4_4_) {
    free((void *)local_58._0_8_);
  }
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x3cd;
  file_05.m_begin = (iterator)&local_248;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_258,
             msg_05);
  if ((long)local_208.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_208.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)local_d8.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = std::__equal<false>::
            equal<std::vector<unsigned_char,std::allocator<unsigned_char>>const*,std::vector<unsigned_char,std::allocator<unsigned_char>>const*>
                      (local_208.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_208.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       local_d8.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    bVar2 = false;
  }
  local_78[0] = bVar2;
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_418._0_8_ = "pushdata2Stack == directStack";
  local_418.m_message.px = (element_type *)0xeae805;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01389048;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_260 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_40 = (string *)&local_418;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar6,
             (size_t)&local_268,0x3cd);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x3ce;
  file_06.m_begin = (iterator)&local_278;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_288,
             msg_06);
  local_418.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_b4 == SCRIPT_ERR_OK);
  local_418.m_message.px = (element_type *)0x0;
  local_418.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_78,local_b4);
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01388e08;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_290 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x1;
  local_40 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_418,(lazy_ostream *)local_58,1,1,WARN,_cVar6,(size_t)&local_298,0x3ce);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,aStack_68._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_418.m_message.pn);
  local_2b8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  local_2b8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  local_2b8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x3d1;
  file_07.m_begin = (iterator)&local_2c8;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2d8,
             msg_07);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,"N\x01",&DAT_00eb0d4f);
  local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_0138d260;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EvalScript(&local_2b8,(CScript *)local_58,1,(BaseSignatureChecker *)&local_360,BASE,&local_b4
                 );
  local_418.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_418.m_message.px = (element_type *)0x0;
  local_418.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "EvalScript(pushdata4Stack, CScript(pushdata4, pushdata4 + sizeof(pushdata4)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err)"
  ;
  local_90.m_message.px = (element_type *)0xeae897;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_01389048;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_90;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_2e0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_418,(lazy_ostream *)local_78,1,0,WARN,_cVar6,(size_t)&local_2e8,0x3d1);
  boost::detail::shared_count::~shared_count(&local_418.m_message.pn);
  if (0x1c < local_40._4_4_) {
    free((void *)local_58._0_8_);
  }
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x3d2;
  file_08.m_begin = (iterator)&local_2f8;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_308,
             msg_08);
  if ((long)local_2b8.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_2b8.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)local_d8.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = std::__equal<false>::
            equal<std::vector<unsigned_char,std::allocator<unsigned_char>>const*,std::vector<unsigned_char,std::allocator<unsigned_char>>const*>
                      (local_2b8.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_2b8.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       local_d8.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    bVar2 = false;
  }
  local_78[0] = bVar2;
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_418._0_8_ = "pushdata4Stack == directStack";
  local_418.m_message.px = (element_type *)0xeae8b5;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01389048;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_310 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_40 = (string *)&local_418;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar6,
             (size_t)&local_318,0x3d2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x3d3;
  file_09.m_begin = (iterator)&local_328;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_338,
             msg_09);
  local_418.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_b4 == SCRIPT_ERR_OK);
  local_418.m_message.px = (element_type *)0x0;
  local_418.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_78,local_b4);
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01388e08;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_340 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x1;
  local_40 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_418,(lazy_ostream *)local_58,1,1,WARN,_cVar6,(size_t)&local_348,0x3d3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,aStack_68._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_418.m_message.pn);
  local_58._0_2_ = 0x14c;
  __l._M_len = 2;
  __l._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_360,__l,(allocator_type *)local_78);
  local_58._0_3_ = 0x14d;
  __l_00._M_len = 3;
  __l_00._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_378,__l_00,(allocator_type *)local_78);
  local_58._0_5_ = 0x14e;
  __l_01._M_len = 5;
  __l_01._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_390,__l_01,(allocator_type *)local_78);
  local_3a8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x3da;
  file_10.m_begin = (iterator)&local_3b8;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3c8,
             msg_10);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_a0._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_0138d260;
  bVar2 = EvalScript(&local_3a8,(CScript *)local_58,1,&local_a0,BASE,&local_b4);
  local_418.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_418.m_message.px = (element_type *)0x0;
  local_418.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "!EvalScript(stack_ignore, CScript(pushdata1_trunc.begin(), pushdata1_trunc.end()), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err)"
  ;
  local_90.m_message.px = (element_type *)0xeae94c;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_01389048;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_90;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3d0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_418,(lazy_ostream *)local_78,1,0,WARN,_cVar6,(size_t)&local_3d8,0x3da);
  boost::detail::shared_count::~shared_count(&local_418.m_message.pn);
  if (0x1c < local_40._4_4_) {
    free((void *)local_58._0_8_);
  }
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x3db;
  file_11.m_begin = (iterator)&local_3e8;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3f8,
             msg_11);
  local_418.m_message.px = (element_type *)((ulong)local_418.m_message.px & 0xffffffffffffff00);
  local_418._0_8_ = &PTR__lazy_ostream_01388f08;
  local_418.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_400 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_b4 == SCRIPT_ERR_BAD_OPCODE);
  local_b0 = &local_41c;
  local_41c = 0xf;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0._vptr_BaseSignatureChecker = (_func_int **)0xead230;
  local_98 = "";
  local_40 = (string *)&local_a8;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_0138d2a0;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_b0;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_0138d2a0;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pcVar5 = "err";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_a8 = &local_b4;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)&local_418,1,2,REQUIRE,0x10f64c2,(size_t)&local_a0,0x3db,
             local_58,"SCRIPT_ERR_BAD_OPCODE",(lazy_ostream *)local_78);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x3dc;
  file_12.m_begin = (iterator)&local_430;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_440,
             msg_12);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_a0._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_0138d260;
  bVar2 = EvalScript(&local_3a8,(CScript *)local_58,1,&local_a0,BASE,&local_b4);
  local_418.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_418.m_message.px = (element_type *)0x0;
  local_418.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "!EvalScript(stack_ignore, CScript(pushdata2_trunc.begin(), pushdata2_trunc.end()), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err)"
  ;
  local_90.m_message.px = (element_type *)0xeae9f9;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_01389048;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_448 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  aStack_68._8_8_ = &local_90;
  boost::test_tools::tt_detail::report_assertion
            (&local_418,(lazy_ostream *)local_78,1,0,WARN,(check_type)pcVar5,(size_t)&local_450,
             0x3dc);
  boost::detail::shared_count::~shared_count(&local_418.m_message.pn);
  if (0x1c < local_40._4_4_) {
    free((void *)local_58._0_8_);
  }
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x3dd;
  file_13.m_begin = (iterator)&local_460;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_470,
             msg_13);
  local_418.m_message.px = (element_type *)((ulong)local_418.m_message.px & 0xffffffffffffff00);
  local_418._0_8_ = &PTR__lazy_ostream_01388f08;
  local_418.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_400 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_b4 == SCRIPT_ERR_BAD_OPCODE);
  local_41c = 0xf;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0._vptr_BaseSignatureChecker = (_func_int **)0xead230;
  local_98 = "";
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_0138d2a0;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40 = (string *)&local_a8;
  local_b0 = &local_41c;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_0138d2a0;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_b0;
  pcVar5 = "err";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_a8 = &local_b4;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)&local_418,1,2,REQUIRE,0x10f64c2,(size_t)&local_a0,0x3dd,
             (CScript *)local_58,"SCRIPT_ERR_BAD_OPCODE",(lazy_ostream *)local_78);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x3de;
  file_14.m_begin = (iterator)&local_480;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_490,
             msg_14);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_390.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_390.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_a0._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_0138d260;
  bVar2 = EvalScript(&local_3a8,(CScript *)local_58,1,&local_a0,BASE,&local_b4);
  local_418.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_418.m_message.px = (element_type *)0x0;
  local_418.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "!EvalScript(stack_ignore, CScript(pushdata4_trunc.begin(), pushdata4_trunc.end()), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err)"
  ;
  local_90.m_message.px = (element_type *)0xeaea90;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_01389048;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_498 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  aStack_68._8_8_ = &local_90;
  boost::test_tools::tt_detail::report_assertion
            (&local_418,(lazy_ostream *)local_78,1,0,WARN,(check_type)pcVar5,(size_t)&local_4a0,
             0x3de);
  boost::detail::shared_count::~shared_count(&local_418.m_message.pn);
  if (0x1c < local_40._4_4_) {
    free((void *)local_58._0_8_);
  }
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x3df;
  file_15.m_begin = (iterator)&local_4b0;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4c0,
             msg_15);
  local_418.m_message.px = (element_type *)((ulong)local_418.m_message.px & 0xffffffffffffff00);
  local_418._0_8_ = &PTR__lazy_ostream_01388f08;
  local_418.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_400 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_b4 == SCRIPT_ERR_BAD_OPCODE);
  local_41c = 0xf;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0._vptr_BaseSignatureChecker = (_func_int **)0xead230;
  local_98 = "";
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_0138d2a0;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40 = (string *)&local_a8;
  local_b0 = &local_41c;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_0138d2a0;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_b0;
  local_a8 = &local_b4;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)&local_418,1,2,REQUIRE,0x10f64c2,(size_t)&local_a0,0x3df,
             (CScript *)local_58,"SCRIPT_ERR_BAD_OPCODE",(lazy_ostream *)local_78);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_3a8);
  if (local_390.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_390.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_390.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_390.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_378.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_360.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_360.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_2b8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_208);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_158);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_PushData)
{
    // Check that PUSHDATA1, PUSHDATA2, and PUSHDATA4 create the same value on
    // the stack as the 1-75 opcodes do.
    static const unsigned char direct[] = { 1, 0x5a };
    static const unsigned char pushdata1[] = { OP_PUSHDATA1, 1, 0x5a };
    static const unsigned char pushdata2[] = { OP_PUSHDATA2, 1, 0, 0x5a };
    static const unsigned char pushdata4[] = { OP_PUSHDATA4, 1, 0, 0, 0, 0x5a };

    ScriptError err;
    std::vector<std::vector<unsigned char> > directStack;
    BOOST_CHECK(EvalScript(directStack, CScript(direct, direct + sizeof(direct)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    std::vector<std::vector<unsigned char> > pushdata1Stack;
    BOOST_CHECK(EvalScript(pushdata1Stack, CScript(pushdata1, pushdata1 + sizeof(pushdata1)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK(pushdata1Stack == directStack);
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    std::vector<std::vector<unsigned char> > pushdata2Stack;
    BOOST_CHECK(EvalScript(pushdata2Stack, CScript(pushdata2, pushdata2 + sizeof(pushdata2)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK(pushdata2Stack == directStack);
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    std::vector<std::vector<unsigned char> > pushdata4Stack;
    BOOST_CHECK(EvalScript(pushdata4Stack, CScript(pushdata4, pushdata4 + sizeof(pushdata4)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK(pushdata4Stack == directStack);
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    const std::vector<unsigned char> pushdata1_trunc{OP_PUSHDATA1, 1};
    const std::vector<unsigned char> pushdata2_trunc{OP_PUSHDATA2, 1, 0};
    const std::vector<unsigned char> pushdata4_trunc{OP_PUSHDATA4, 1, 0, 0, 0};

    std::vector<std::vector<unsigned char>> stack_ignore;
    BOOST_CHECK(!EvalScript(stack_ignore, CScript(pushdata1_trunc.begin(), pushdata1_trunc.end()), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK_EQUAL(err, SCRIPT_ERR_BAD_OPCODE);
    BOOST_CHECK(!EvalScript(stack_ignore, CScript(pushdata2_trunc.begin(), pushdata2_trunc.end()), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK_EQUAL(err, SCRIPT_ERR_BAD_OPCODE);
    BOOST_CHECK(!EvalScript(stack_ignore, CScript(pushdata4_trunc.begin(), pushdata4_trunc.end()), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK_EQUAL(err, SCRIPT_ERR_BAD_OPCODE);
}